

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::BackgroundResetMarks(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  ResetMarkFlags flags;
  undefined8 *in_FS_OFFSET;
  Recycler *this_local;
  
  bVar2 = IsMarkStackEmpty(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15b4,"(IsMarkStackEmpty())","IsMarkStackEmpty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this->scanPinnedObjectMap = true;
  this->hasScannedInitialImplicitRoots = false;
  HeapBlockMap64::ResetMarks(&this->heapBlockMap);
  flags = ResetMarkFlags_Background;
  if ((this->enableScanImplicitRoots & 1U) != 0) {
    flags = ResetMarkFlags_InBackgroundThreadImplicitRoots;
  }
  HeapInfoManager::ResetMarks(&this->autoHeap,flags);
  return;
}

Assistant:

void
Recycler::BackgroundResetMarks()
{
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::BackgroundResetMarksPhase);
    GCETW(GC_BACKGROUNDRESETMARKS_START, (this));
    Assert(IsMarkStackEmpty());
    this->scanPinnedObjectMap = true;
    this->hasScannedInitialImplicitRoots = false;

    heapBlockMap.ResetMarks();

    autoHeap.ResetMarks(this->enableScanImplicitRoots ? ResetMarkFlags_InBackgroundThreadImplicitRoots : ResetMarkFlags_InBackgroundThread);

    GCETW(GC_BACKGROUNDRESETMARKS_STOP, (this));
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::BackgroundResetMarksPhase);
}